

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O2

void __thiscall chrono::ChAssembly::AddMesh(ChAssembly *this,shared_ptr<chrono::fea::ChMesh> *mesh)

{
  element_type *peVar1;
  ChSystem *pCVar2;
  __normal_iterator<std::shared_ptr<chrono::fea::ChMesh>_*,_std::vector<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>_>
  _Var3;
  
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::fea::ChMesh>*,std::vector<std::shared_ptr<chrono::fea::ChMesh>,std::allocator<std::shared_ptr<chrono::fea::ChMesh>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::fea::ChMesh>const>>
                    ((this->meshlist).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->meshlist).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,mesh);
  if (_Var3._M_current ==
      (this->meshlist).
      super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    peVar1 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar1->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[6])
              (peVar1,(this->super_ChPhysicsItem).system);
    std::
    vector<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
    ::push_back(&this->meshlist,mesh);
    pCVar2 = (this->super_ChPhysicsItem).system;
    pCVar2->is_initialized = false;
    pCVar2->is_updated = false;
    return;
  }
  __assert_fail("std::find(std::begin(meshlist), std::end(meshlist), mesh) == meshlist.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChAssembly.cpp"
                ,0xd4,"void chrono::ChAssembly::AddMesh(std::shared_ptr<fea::ChMesh>)");
}

Assistant:

void ChAssembly::AddMesh(std::shared_ptr<fea::ChMesh> mesh) {
    assert(std::find(std::begin(meshlist), std::end(meshlist), mesh) == meshlist.end());

    mesh->SetSystem(system);
    meshlist.push_back(mesh);

	system->is_initialized = false;
    system->is_updated = false;
}